

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

Atom * __thiscall Potassco::SmodelsConvert::SmData::mapAtom(SmData *this,Atom_t a)

{
  uint uVar1;
  bool bVar2;
  pointer pAVar3;
  ulong uVar4;
  
  bVar2 = mapped(this,a);
  uVar4 = (ulong)a;
  if (!bVar2) {
    pAVar3 = (this->atoms_).
             super__Vector_base<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->atoms_).
                      super__Vector_base<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3 >> 2) <= uVar4) {
      std::
      vector<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
      ::resize(&this->atoms_,(ulong)(a + 1));
      pAVar3 = (this->atoms_).
               super__Vector_base<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    uVar1 = this->next_;
    this->next_ = uVar1 + 1;
    pAVar3[uVar4] = (Atom)((uint)pAVar3[uVar4] & 0xf0000000 | uVar1 & 0xfffffff);
  }
  return (this->atoms_).
         super__Vector_base<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
         ._M_impl.super__Vector_impl_data._M_start + uVar4;
}

Assistant:

Atom&  mapAtom(Atom_t a) {
		if (mapped(a)) { return atoms_[a]; }
		if (a >= atoms_.size()) { atoms_.resize(a + 1); }
		atoms_[a].smId = next_++;
		return atoms_[a];
	}